

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O3

HighsStatus __thiscall Highs::passRowName(Highs *this,HighsInt row,string *name)

{
  uint uVar1;
  ulong uVar2;
  
  uVar2 = (ulong)(uint)row;
  uVar1 = (this->model_).lp_.num_row_;
  if (row < 0 || (int)uVar1 <= row) {
    highsLogUser(&(this->options_).super_HighsOptionsStruct.log_options,kError,
                 "Index %d for row name %s is outside the range [0, num_row = %d)\n",uVar2,
                 (name->_M_dataplus)._M_p);
  }
  else {
    if (0 < (int)name->_M_string_length) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::resize(&(this->model_).lp_.row_names_,(ulong)uVar1);
      HighsNameHash::update
                (&(this->model_).lp_.row_hash_,row,
                 (this->model_).lp_.row_names_.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar2,name);
      std::__cxx11::string::_M_assign
                ((string *)
                 ((this->model_).lp_.row_names_.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + uVar2));
      return kOk;
    }
    highsLogUser(&(this->options_).super_HighsOptionsStruct.log_options,kError,
                 "Cannot define empty column names\n");
  }
  return kError;
}

Assistant:

HighsStatus Highs::passRowName(const HighsInt row, const std::string& name) {
  const HighsInt num_row = this->model_.lp_.num_row_;
  if (row < 0 || row >= num_row) {
    highsLogUser(
        options_.log_options, HighsLogType::kError,
        "Index %d for row name %s is outside the range [0, num_row = %d)\n",
        int(row), name.c_str(), int(num_row));
    return HighsStatus::kError;
  }
  if (int(name.length()) <= 0) {
    highsLogUser(options_.log_options, HighsLogType::kError,
                 "Cannot define empty column names\n");
    return HighsStatus::kError;
  }
  this->model_.lp_.row_names_.resize(num_row);
  this->model_.lp_.row_hash_.update(row, this->model_.lp_.row_names_[row],
                                    name);
  this->model_.lp_.row_names_[row] = name;
  return HighsStatus::kOk;
}